

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  ImGuiContextHook *pIVar1;
  int iVar2;
  long in_RDI;
  ImGuiContext *g;
  ImGuiContextHook *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  ImVector<ImGuiContextHook>::push_back
            ((ImVector<ImGuiContextHook> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
            );
  iVar2 = *(int *)(in_RDI + 0x5ba8) + 1;
  *(int *)(in_RDI + 0x5ba8) = iVar2;
  pIVar1 = ImVector<ImGuiContextHook>::back((ImVector<ImGuiContextHook> *)(in_RDI + 0x5b98));
  *(int *)pIVar1 = iVar2;
  return *(ImGuiID *)(in_RDI + 0x5ba8);
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}